

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ObjEvalEdgeDelay(Gia_Man_t *p,int iObj,Vec_Int_t *vDelay)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_54;
  int local_44;
  int local_34;
  int DelayMax;
  int Delay;
  int iFan;
  int i;
  int nEdgeDelay;
  Vec_Int_t *vDelay_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  local_34 = 0;
  iVar1 = Gia_ManHasMapping(p);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjIsLut(p,iObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsLut2(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0xc6,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
    }
    iVar1 = Gia_ObjLutSize2(p,iObj);
    if (4 < iVar1) {
      __assert_fail("Gia_ObjLutSize2(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0xbf,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
    }
    for (Delay = 0; iVar1 = Gia_ObjLutSize2(p,iObj), Delay < iVar1; Delay = Delay + 1) {
      iVar1 = Gia_ObjLutFanin2(p,iObj,Delay);
      iVar2 = Vec_IntEntry(vDelay,iVar1);
      iVar1 = Gia_ObjHaveEdge(p,iObj,iVar1);
      if (iVar1 == 0) {
        local_54 = 10;
      }
      else {
        local_54 = 2;
      }
      local_34 = Abc_MaxInt(local_34,iVar2 + local_54);
    }
  }
  else {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (4 < iVar1) {
      __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0xb6,"int Gia_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
    }
    for (Delay = 0; iVar1 = Gia_ObjLutSize(p,iObj), Delay < iVar1; Delay = Delay + 1) {
      piVar3 = Gia_ObjLutFanins(p,iObj);
      iVar1 = piVar3[Delay];
      iVar2 = Vec_IntEntry(vDelay,iVar1);
      iVar1 = Gia_ObjHaveEdge(p,iObj,iVar1);
      if (iVar1 == 0) {
        local_44 = 10;
      }
      else {
        local_44 = 2;
      }
      local_34 = Abc_MaxInt(local_34,iVar2 + local_44);
    }
  }
  return local_34;
}

Assistant:

static inline int Gia_ObjEvalEdgeDelay( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay )
{
    int nEdgeDelay = 2;
    int i, iFan, Delay, DelayMax = 0;
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry(vDelay, iFan) + (Gia_ObjHaveEdge(p, iObj, iFan) ? nEdgeDelay : 10);
            DelayMax = Abc_MaxInt( DelayMax, Delay );
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        assert( Gia_ObjLutSize2(p, iObj) <= 4 );
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            Delay = Vec_IntEntry(vDelay, iFan) + (Gia_ObjHaveEdge(p, iObj, iFan) ? nEdgeDelay : 10);
            DelayMax = Abc_MaxInt( DelayMax, Delay );
        }
    }
    else assert( 0 );
    return DelayMax;
}